

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall
wasm::WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>::runOnFunction
          (WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_> *this,
          Module *module,Function *func)

{
  PassRunner *pPVar1;
  Function *func_local;
  Module *module_local;
  WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_> *this_local;
  
  pPVar1 = Pass::getPassRunner(&this->super_Pass);
  if (pPVar1 != (PassRunner *)0x0) {
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::walkFunctionInModule
              (&(this->super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>).
                super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,func,module);
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x223,
                "virtual void wasm::WalkerPass<wasm::PostWalker<Replacer>>::runOnFunction(Module *, Function *) [WalkerType = wasm::PostWalker<Replacer>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }